

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void ON_WarningEx(char *sFileName,int line_number,char *sFunctionName,char *sFormat,...)

{
  char in_AL;
  bool bVar1;
  char *description_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1b8 [32];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined1 local_108 [8];
  ON_ErrorEvent error_event;
  undefined1 local_58 [8];
  va_list args;
  ON_String local_38;
  ON_String description;
  bool bPrintErrorMessage;
  char *sFormat_local;
  char *sFunctionName_local;
  int line_number_local;
  char *sFileName_local;
  
  if (in_AL != '\0') {
    local_188 = in_XMM0_Qa;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  local_198 = in_R8;
  local_190 = in_R9;
  ON_IncrementWarningCount();
  description.m_s._7_1_ = ON_Internal_PrintWarningMessage();
  if (((bool)description.m_s._7_1_) || (bVar1 = ON_Internal_LogError(), bVar1)) {
    ON_String::ON_String(&local_38);
    if ((sFormat != (char *)0x0) && (*sFormat != '\0')) {
      args[0].overflow_arg_area = local_1b8;
      args[0]._0_8_ = &stack0x00000008;
      local_58._4_4_ = 0x30;
      local_58._0_4_ = 0x20;
      ON_String::FormatVargs(&local_38,sFormat,(__va_list_tag *)local_58);
    }
    description_00 = ON_String::operator_cast_to_char_(&local_38);
    ON_ErrorEvent::ON_ErrorEvent
              ((ON_ErrorEvent *)local_108,Warning,sFileName,line_number,sFunctionName,description_00
              );
    ON_Internal_RecordErrorEvent((ON_ErrorEvent *)local_108,(bool)(description.m_s._7_1_ & 1));
    ON_String::~ON_String(&local_38);
  }
  return;
}

Assistant:

void ON_VARGS_FUNC_CDECL ON_WarningEx(
  const char* sFileName, 
  int line_number,
  const char* sFunctionName,
  const char* sFormat,
  ...
)
{
  ON_IncrementWarningCount();

  const bool bPrintErrorMessage = ON_Internal_PrintWarningMessage();
  if ( bPrintErrorMessage || ON_Internal_LogError())
  {
    ON_String description;
    if (sFormat && sFormat[0]) 
    {
      va_list args;
      va_start(args, sFormat);
      description.FormatVargs(sFormat, args);
      va_end(args);
    }

    const ON_ErrorEvent error_event(
      ON_ErrorEvent::Type::Warning,
      sFileName,
      (unsigned int)line_number,
      sFunctionName,
      description
    );

    ON_Internal_RecordErrorEvent(error_event, bPrintErrorMessage);
  }

}